

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_NodeCompareSims(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj0,Ivy_Obj_t *pObj1)

{
  Ivy_FraigSim_t *pIVar1;
  Ivy_FraigSim_t *pIVar2;
  int local_3c;
  int i;
  Ivy_FraigSim_t *pSims1;
  Ivy_FraigSim_t *pSims0;
  Ivy_Obj_t *pObj1_local;
  Ivy_Obj_t *pObj0_local;
  Ivy_FraigMan_t *p_local;
  
  pIVar1 = Ivy_ObjSim(pObj0);
  pIVar2 = Ivy_ObjSim(pObj1);
  local_3c = 0;
  while( true ) {
    if (p->nSimWords <= local_3c) {
      return 1;
    }
    if ((&pIVar1[1].Type)[local_3c] != (&pIVar2[1].Type)[local_3c]) break;
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

int Ivy_NodeCompareSims( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj0, Ivy_Obj_t * pObj1 )
{
    Ivy_FraigSim_t * pSims0, * pSims1;
    int i;
    pSims0 = Ivy_ObjSim(pObj0);
    pSims1 = Ivy_ObjSim(pObj1);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims0->pData[i] != pSims1->pData[i] )
            return 0;
    return 1;
}